

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

void __thiscall cmLBDepend::GenerateDependInformation(cmLBDepend *this,cmDependInformation *info)

{
  cmMakefile *this_00;
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  cmSourceFile *pcVar5;
  string *psVar6;
  reference pbVar7;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string incpath;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  cmSourceFile *local_88;
  cmSourceFile *srcFile;
  string *file;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  cmSourceFile *cFile;
  bool found;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *path;
  cmDependInformation *info_local;
  cmLBDepend *this_local;
  
  if ((info->DependDone & 1U) == 0) {
    info->DependDone = true;
    local_20 = &info->FullPath;
    path = (string *)info;
    info_local = (cmDependInformation *)this;
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cFile._3_1_ = cmsys::SystemTools::FileExists(local_20,true);
      if (cFile._3_1_) {
        DependWalk(this,(cmDependInformation *)path);
      }
      if (*(long *)((long)&path[1].field_2 + 8) != 0) {
        pcVar5 = *(cmSourceFile **)((long)&path[1].field_2 + 8);
        pvVar4 = cmSourceFile::GetDepends_abi_cxx11_(pcVar5);
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(pvVar4);
        if (!bVar1) {
          pvVar4 = cmSourceFile::GetDepends_abi_cxx11_(pcVar5);
          __end3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(pvVar4);
          file = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pvVar4);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&file), bVar1) {
            srcFile = (cmSourceFile *)
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
            psVar6 = path;
            pcVar8 = (char *)std::__cxx11::string::c_str();
            AddDependency(this,(cmDependInformation *)psVar6,pcVar8);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end3);
          }
          cFile._3_1_ = true;
        }
      }
      if (cFile._3_1_ == false) {
        this_00 = this->Makefile;
        cmsys::SystemTools::GetFilenameWithoutExtension((string *)&__range4,local_20);
        pcVar5 = cmMakefile::GetSource(this_00,(string *)&__range4,Ambiguous);
        std::__cxx11::string::~string((string *)&__range4);
        local_88 = pcVar5;
        if (pcVar5 != (cmSourceFile *)0x0) {
          psVar6 = cmSourceFile::GetFullPath(pcVar5,(string *)0x0);
          _Var2 = std::operator==(psVar6,local_20);
          if (_Var2) {
            cFile._3_1_ = true;
          }
          else {
            __end4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&this->IncludeDirectories);
            incpath.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->IncludeDirectories);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)((long)&incpath.field_2 + 8)), bVar1) {
              pbVar7 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&__end4);
              std::__cxx11::string::string((string *)local_e0,(string *)pbVar7);
              uVar3 = std::__cxx11::string::empty();
              if (((uVar3 & 1) == 0) &&
                 (pcVar8 = (char *)std::__cxx11::string::back(), *pcVar8 != '/')) {
                std::operator+(&local_100,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_e0,"/");
                std::__cxx11::string::operator=((string *)local_e0,(string *)&local_100);
                std::__cxx11::string::~string((string *)&local_100);
              }
              std::operator+(&local_120,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e0,local_20);
              std::__cxx11::string::operator=((string *)local_e0,(string *)&local_120);
              std::__cxx11::string::~string((string *)&local_120);
              psVar6 = cmSourceFile::GetFullPath(local_88,(string *)0x0);
              _Var2 = std::operator==(psVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_e0);
              if (_Var2) {
                std::__cxx11::string::operator=((string *)(path + 2),(string *)local_e0);
                cFile._3_1_ = true;
              }
              std::__cxx11::string::~string((string *)local_e0);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end4);
            }
          }
        }
      }
      if (cFile._3_1_ == false) {
        bVar1 = cmsys::RegularExpression::find(&this->ComplainFileRegularExpression,path + 4);
        if (bVar1) {
          std::operator+(&local_140,"error cannot find dependencies for ",local_20);
          cmSystemTools::Error(&local_140);
          std::__cxx11::string::~string((string *)&local_140);
        }
        else {
          std::__cxx11::string::clear();
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Attempt to find dependencies for file without path!",&local_41
                );
      cmSystemTools::Error(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
    }
  }
  return;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if (info->DependDone) {
      return;
    }
    // Make sure we don't visit the same file more than once.
    info->DependDone = true;

    const std::string& path = info->FullPath;
    if (path.empty()) {
      cmSystemTools::Error(
        "Attempt to find dependencies for file without path!");
      return;
    }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if (cmSystemTools::FileExists(path, true)) {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
    }

    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if (info->SourceFile != nullptr) {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if (!cFile.GetDepends().empty()) {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for (std::string const& file : cFile.GetDepends()) {
          this->AddDependency(info, file.c_str());
        }

        // Found dependency information.  We are done.
        found = true;
      }
    }

    if (!found) {
      // Try to find the file amongst the sources
      cmSourceFile* srcFile = this->Makefile->GetSource(
        cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile) {
        if (srcFile->GetFullPath() == path) {
          found = true;
        } else {
          // try to guess which include path to use
          for (std::string incpath : this->IncludeDirectories) {
            if (!incpath.empty() && incpath.back() != '/') {
              incpath = incpath + "/";
            }
            incpath = incpath + path;
            if (srcFile->GetFullPath() == incpath) {
              // set the path to the guessed path
              info->FullPath = incpath;
              found = true;
            }
          }
        }
      }
    }

    if (!found) {
      // Couldn't find any dependency information.
      if (this->ComplainFileRegularExpression.find(info->IncludeName)) {
        cmSystemTools::Error("error cannot find dependencies for " + path);
      } else {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath.clear();
      }
    }
  }